

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::AddBoundary
          (Impl *this,int a_region_id,bool invert_a,bool invert_b,bool invert_result,
          vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
          *a_chain_starts,CrossingProcessor *cp)

{
  S2ShapeIndex *pSVar1;
  S2ShapeIndex *b_index_00;
  int32 _shape_id;
  bool bVar2;
  int iVar3;
  uint chain_id_00;
  reference pSVar4;
  ShapeEdgeId *pSVar5;
  undefined4 extraout_var;
  Chain chain_00;
  ostream *poVar6;
  bool local_149;
  ShapeEdgeId local_134;
  ShapeEdgeId local_12c;
  ShapeEdgeId local_124;
  ShapeEdgeId local_11c;
  ShapeEdgeId local_114;
  byte local_f9;
  S2LogMessage local_f8;
  S2LogMessageVoidify local_e1;
  ShapeEdgeId local_e0;
  ShapeEdgeId local_d8;
  ShapeEdgeId local_d0;
  ShapeEdgeId a_id;
  int chain_limit;
  bool start_inside;
  Chain chain;
  int chain_id;
  ChainPosition chain_position;
  int edge_id;
  S2Shape *a_shape;
  int a_shape_id;
  ShapeEdgeId local_80;
  ShapeEdgeId local_78;
  ShapeEdgeId next_id;
  CrossingIterator next_crossing;
  const_iterator next_start;
  S2ShapeIndex *b_index;
  S2ShapeIndex *a_index;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *a_chain_starts_local;
  bool invert_result_local;
  bool invert_b_local;
  bool invert_a_local;
  int a_region_id_local;
  Impl *this_local;
  S2Shape *a_shape_00;
  int extraout_var_00;
  
  pSVar1 = this->op_->regions_[a_region_id];
  b_index_00 = this->op_->regions_[1 - a_region_id];
  bVar2 = GetIndexCrossings(this,a_region_id);
  if (bVar2) {
    CrossingProcessor::StartBoundary(cp,a_region_id,invert_a,invert_b,invert_result);
    next_crossing._40_8_ =
         std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::begin
                   (a_chain_starts);
    CrossingIterator::CrossingIterator
              ((CrossingIterator *)&next_id,b_index_00,&this->index_crossings_,true);
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
             ::operator*((__normal_iterator<const_s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
                          *)&next_crossing.b_info_.limit);
    local_80 = CrossingIterator::a_id((CrossingIterator *)&next_id);
    pSVar5 = std::min<s2shapeutil::ShapeEdgeId>(pSVar4,&local_80);
    local_78 = *pSVar5;
    while (bVar2 = s2shapeutil::ShapeEdgeId::operator!=(&local_78,kSentinel), bVar2) {
      _shape_id = local_78.shape_id;
      iVar3 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,(ulong)local_78 & 0xffffffff);
      a_shape_00 = (S2Shape *)CONCAT44(extraout_var,iVar3);
      CrossingProcessor::StartShape(cp,a_shape_00);
      while (local_78.shape_id == _shape_id) {
        chain_position.chain_id = local_78.edge_id;
        chain_id_00 = (*a_shape_00->_vptr_S2Shape[9])(a_shape_00,(ulong)(uint)local_78.edge_id);
        chain_00.start = (*a_shape_00->_vptr_S2Shape[7])(a_shape_00,(ulong)chain_id_00);
        chain_00.length = extraout_var_00;
        pSVar4 = __gnu_cxx::
                 __normal_iterator<const_s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
                 ::operator*((__normal_iterator<const_s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
                              *)&next_crossing.b_info_.limit);
        bVar2 = s2shapeutil::ShapeEdgeId::operator==(&local_78,*pSVar4);
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
          ::operator++((__normal_iterator<const_s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
                        *)&next_crossing.b_info_.limit);
        }
        unique0x1000045f = chain_00;
        CrossingProcessor::StartChain(cp,chain_id_00,chain_00,bVar2);
        a_id.shape_id = chain_00.start + extraout_var_00;
        while (chain_position.chain_id < a_id.shape_id) {
          s2shapeutil::ShapeEdgeId::ShapeEdgeId(&local_d0,_shape_id,chain_position.chain_id);
          bVar2 = CrossingProcessor::inside(cp);
          local_f9 = 0;
          local_149 = true;
          if (!bVar2) {
            local_d8 = CrossingIterator::a_id((CrossingIterator *)&next_id);
            local_e0 = local_d0;
            local_149 = s2shapeutil::ShapeEdgeId::operator==(&local_d8,local_d0);
          }
          if (((local_149 ^ 0xffU) & 1) != 0) {
            S2FatalLogMessage::S2FatalLogMessage
                      ((S2FatalLogMessage *)&local_f8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                       ,0x6e5,kFatal,(ostream *)&std::cerr);
            local_f9 = 1;
            poVar6 = S2LogMessage::stream(&local_f8);
            poVar6 = std::operator<<(poVar6,
                                     "Check failed: cp->inside() || next_crossing.a_id() == a_id ");
            S2LogMessageVoidify::operator&(&local_e1,poVar6);
          }
          if ((local_f9 & 1) != 0) {
            S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_f8);
          }
          local_114.shape_id = local_d0.shape_id;
          local_114.edge_id = local_d0.edge_id;
          bVar2 = CrossingProcessor::ProcessEdge(cp,local_d0,(CrossingIterator *)&next_id);
          if (!bVar2) {
            return false;
          }
          bVar2 = CrossingProcessor::inside(cp);
          if (bVar2) {
            chain_position.chain_id = chain_position.chain_id + 1;
          }
          else {
            local_11c = CrossingIterator::a_id((CrossingIterator *)&next_id);
            bVar2 = false;
            if (local_11c.shape_id == _shape_id) {
              local_124 = CrossingIterator::a_id((CrossingIterator *)&next_id);
              bVar2 = local_124.edge_id < a_id.shape_id;
            }
            if (!bVar2) break;
            local_12c = CrossingIterator::a_id((CrossingIterator *)&next_id);
            chain_position.chain_id = local_12c.edge_id;
          }
        }
        pSVar4 = __gnu_cxx::
                 __normal_iterator<const_s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
                 ::operator*((__normal_iterator<const_s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
                              *)&next_crossing.b_info_.limit);
        local_134 = CrossingIterator::a_id((CrossingIterator *)&next_id);
        pSVar5 = std::min<s2shapeutil::ShapeEdgeId>(pSVar4,&local_134);
        local_78 = *pSVar5;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool S2BooleanOperation::Impl::AddBoundary(
    int a_region_id, bool invert_a, bool invert_b, bool invert_result,
    const vector<ShapeEdgeId>& a_chain_starts, CrossingProcessor* cp) {
  const S2ShapeIndex& a_index = *op_->regions_[a_region_id];
  const S2ShapeIndex& b_index = *op_->regions_[1 - a_region_id];
  if (!GetIndexCrossings(a_region_id)) return false;
  cp->StartBoundary(a_region_id, invert_a, invert_b, invert_result);

  // Walk the boundary of region A and build a list of all edge crossings.
  // We also keep track of whether the current vertex is inside region B.
  auto next_start = a_chain_starts.begin();
  CrossingIterator next_crossing(&b_index, &index_crossings_,
                                 true /*crossings_complete*/);
  ShapeEdgeId next_id = min(*next_start, next_crossing.a_id());
  while (next_id != kSentinel) {
    int a_shape_id = next_id.shape_id;
    const S2Shape& a_shape = *a_index.shape(a_shape_id);
    cp->StartShape(&a_shape);
    while (next_id.shape_id == a_shape_id) {
      // TODO(ericv): Special handling of dimension 0?  Can omit most of this
      // code, including the loop, since all chains are of length 1.
      int edge_id = next_id.edge_id;
      S2Shape::ChainPosition chain_position = a_shape.chain_position(edge_id);
      int chain_id = chain_position.chain_id;
      S2Shape::Chain chain = a_shape.chain(chain_id);
      bool start_inside = (next_id == *next_start);
      if (start_inside) ++next_start;
      cp->StartChain(chain_id, chain, start_inside);
      int chain_limit = chain.start + chain.length;
      while (edge_id < chain_limit) {
        ShapeEdgeId a_id(a_shape_id, edge_id);
        S2_DCHECK(cp->inside() || next_crossing.a_id() == a_id);
        if (!cp->ProcessEdge(a_id, &next_crossing)) {
          return false;
        }
        if (cp->inside()) {
          ++edge_id;
        } else if (next_crossing.a_id().shape_id == a_shape_id &&
                   next_crossing.a_id().edge_id < chain_limit) {
          edge_id = next_crossing.a_id().edge_id;
        } else {
          break;
        }
      }
      next_id = min(*next_start, next_crossing.a_id());
    }
  }
  return true;
}